

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int sort_5_3::merge_5(int *a,int left,int right,int mid)

{
  code *pcVar1;
  long local_48;
  int local_40;
  int local_3c;
  int k_1;
  int k;
  int j;
  int i;
  unsigned_long __vla_expr0;
  int local_1c;
  int local_18;
  int mid_local;
  int right_local;
  int left_local;
  int *a_local;
  
  __vla_expr0 = (unsigned_long)&local_48;
  _j = (ulong)((right - left) + 1);
  local_48 = (long)&local_48 - (_j * 4 + 0xf & 0xfffffffffffffff0);
  k_1 = mid + 1;
  for (local_3c = left; local_40 = left, k = left, local_3c <= right; local_3c = local_3c + 1) {
    *(int *)(local_48 + (long)(local_3c - left) * 4) = a[local_3c];
  }
  for (; local_40 <= right; local_40 = local_40 + 1) {
    if (mid < k) {
      a[local_40] = *(int *)(local_48 + (long)(k_1 - left) * 4);
      k_1 = k_1 + 1;
    }
    else if (right < k_1) {
      a[local_40] = *(int *)(local_48 + (long)(k - left) * 4);
      k = k + 1;
    }
    else if (*(int *)(local_48 + (long)(k_1 - left) * 4) < *(int *)(local_48 + (long)(k - left) * 4)
            ) {
      a[local_40] = *(int *)(local_48 + (long)(k_1 - left) * 4);
      k_1 = k_1 + 1;
    }
    else {
      a[local_40] = *(int *)(local_48 + (long)(k - left) * 4);
      k = k + 1;
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  local_1c = mid;
  local_18 = right;
  mid_local = left;
  _right_local = a;
  (*pcVar1)();
}

Assistant:

int merge_5(int *a, int left, int right, int mid) {
        int t[right - left + 1], i = left, j = mid + 1;

        for (int k = left; k <= right; k++) {
            t[k - left] = a[k];
        }

        for (int k = left; k <= right; k++) {
            if (i > mid) {
                a[k] = t[j - left];
                j++;
            } else if (j > right) {
                a[k] = t[i - left];
                i++;
            } else if (t[i - left] > t[j - left]) {
                a[k] = t[j - left];
                j++;
            } else {
                a[k] = t[i - left];
                i++;
            }
        }
    }